

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

double time_oc<trng::yarn5>(yarn5 *r)

{
  ulong uVar1;
  time_t *in_RSI;
  double dVar2;
  string res;
  long i;
  long max;
  timer T;
  double s;
  double *in_stack_00000128;
  timer *in_stack_ffffffffffffff90;
  string local_50 [32];
  long local_30;
  long local_28;
  timer local_20;
  double local_10;
  
  local_10 = 0.0;
  timer::timer(in_stack_ffffffffffffff90);
  local_28 = 0x1000000;
  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
    dVar2 = trng::utility::uniformoc<double,trng::yarn5>((yarn5 *)0x114b74);
    local_10 = dVar2 + local_10;
  }
  timer::time(&local_20,in_RSI);
  to_string<double>(in_stack_00000128);
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (9 < uVar1) break;
    std::__cxx11::string::operator+=(local_50,' ');
  }
  std::operator<<((ostream *)&std::cout,local_50);
  dVar2 = local_10;
  std::__cxx11::string::~string(local_50);
  return dVar2;
}

Assistant:

double time_oc(R &r) {
  double s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += trng::utility::uniformoc<double>(r);
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}